

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::cubeCornersMesh(Mesh *__return_storage_ptr__,vec3 *_min_v,vec3 *_max_v,float _size)

{
  float fVar1;
  vec3 H;
  vec3 G;
  vec3 F;
  vec3 A;
  vec<3,_float,_(glm::qualifier)0> local_188;
  vec<3,_float,_(glm::qualifier)0> local_178;
  vec3 local_168;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_158;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_154;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_150;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_148;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_144;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_140;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_138;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_134;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_130;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_12c;
  vec3 local_128;
  vec3 local_118;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_108;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_104;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_100;
  vec3 local_f8;
  Mesh local_e8;
  float local_40;
  float local_3c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_38;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_34;
  undefined8 uStack_30;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_28;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_24;
  undefined8 uStack_20;
  
  local_3c = _size;
  local_40 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(_min_v);
  fVar1 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(_max_v);
  local_140 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)(_max_v->field_2).z;
  local_128.field_0 = _max_v->field_0;
  local_128.field_1 = _max_v->field_1;
  local_168.field_2 = _min_v->field_2;
  local_168.field_0 = _min_v->field_0;
  local_168.field_1 = _min_v->field_1;
  uStack_20 = 0;
  uStack_30 = 0;
  local_158 = local_128.field_0;
  aStack_154 = local_168.field_1;
  local_150 = local_168.field_2;
  local_148 = local_128.field_0;
  aStack_144 = local_168.field_1;
  local_138 = local_168.field_0;
  aStack_134 = local_128.field_1;
  local_130 = local_168.field_2;
  local_12c = local_140;
  local_128.field_2 = local_168.field_2;
  local_118._0_8_ = local_128._0_8_;
  local_118.field_2 = local_140;
  local_108 = local_168.field_0;
  aStack_104 = local_128.field_1;
  local_100 = local_140;
  local_f8._0_8_ = local_168._0_8_;
  local_f8.field_2 = local_140;
  _local_38 = local_168._0_8_;
  _local_28 = local_128._0_8_;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = LINES;
  local_188.field_0.x = local_38.x - local_28.x;
  local_188.field_1.y = aStack_24.y - aStack_24.y;
  local_188.field_2.z = local_12c.z - local_12c.z;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  if (local_40 <= fVar1) {
    fVar1 = local_40;
  }
  fVar1 = fVar1 * local_3c * 0.5;
  lineToMesh(&local_e8,&local_118,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_128.field_2.z - local_118.field_2.z;
  local_188.field_0.x = local_128.field_0.x - local_118.field_0.x;
  local_188.field_1.y = local_128.field_1.y - local_118.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_118,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_140.z - local_118.field_2.z;
  local_188.field_0.x = local_148.x - local_118.field_0.x;
  local_188.field_1.y = aStack_144.y - local_118.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_118,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_118.field_2.z - local_128.field_2.z;
  local_188.field_0.x = local_118.field_0.x - local_128.field_0.x;
  local_188.field_1.y = local_118.field_1.y - local_128.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_128,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_130.z - local_128.field_2.z;
  local_188.field_0.x = local_138.x - local_128.field_0.x;
  local_188.field_1.y = aStack_134.y - local_128.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_128,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_150.z - local_128.field_2.z;
  local_188.field_0.x = local_158.x - local_128.field_0.x;
  local_188.field_1.y = aStack_154.y - local_128.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_128,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_100.z - local_130.z;
  local_188.field_0.x = local_108.x - local_138.x;
  local_188.field_1.y = aStack_104.y - aStack_134.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_138,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_128.field_2.z - local_130.z;
  local_188.field_0.x = local_128.field_0.x - local_138.x;
  local_188.field_1.y = local_128.field_1.y - aStack_134.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_138,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_168.field_2.z - local_130.z;
  local_188.field_0.x = local_168.field_0.x - local_138.x;
  local_188.field_1.y = local_168.field_1.y - aStack_134.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_138,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_118.field_2.z - local_100.z;
  local_188.field_0.x = local_118.field_0.x - local_108.x;
  local_188.field_1.y = local_118.field_1.y - aStack_104.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_108,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_130.z - local_100.z;
  local_188.field_0.x = local_138.x - local_108.x;
  local_188.field_1.y = aStack_134.y - aStack_104.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_108,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_12c.z - local_100.z;
  local_188.field_0.x = local_38.x - local_108.x;
  local_188.field_1.y = aStack_34.y - aStack_104.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_108,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_150.z - local_140.z;
  local_188.field_0.x = local_158.x - local_148.x;
  local_188.field_1.y = aStack_154.y - aStack_144.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_148,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_118.field_2.z - local_140.z;
  local_188.field_0.x = local_118.field_0.x - local_148.x;
  local_188.field_1.y = local_118.field_1.y - aStack_144.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_148,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_12c.z - local_140.z;
  local_188.field_0.x = local_38.x - local_148.x;
  local_188.field_1.y = aStack_34.y - aStack_144.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_148,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_168.field_2.z - local_150.z;
  local_188.field_0.x = local_168.field_0.x - local_158.x;
  local_188.field_1.y = local_168.field_1.y - aStack_154.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_158,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_140.z - local_150.z;
  local_188.field_0.x = local_148.x - local_158.x;
  local_188.field_1.y = aStack_144.y - aStack_154.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_158,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_128.field_2.z - local_150.z;
  local_188.field_0.x = local_128.field_0.x - local_158.x;
  local_188.field_1.y = local_128.field_1.y - aStack_154.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,(vec3 *)&local_158,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_12c.z - local_168.field_2.z;
  local_188.field_0.x = local_38.x - local_168.field_0.x;
  local_188.field_1.y = aStack_34.y - local_168.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_168,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_150.z - local_168.field_2.z;
  local_188.field_0.x = local_158.x - local_168.field_0.x;
  local_188.field_1.y = aStack_154.y - local_168.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_168,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_130.z - local_168.field_2.z;
  local_188.field_0.x = local_138.x - local_168.field_0.x;
  local_188.field_1.y = aStack_134.y - local_168.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_168,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_0.x = local_148.x - local_38.x;
  local_188.field_1.y = aStack_144.y - aStack_34.y;
  local_188.field_2.z = local_140.z - local_12c.z;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_f8,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_168.field_2.z - local_f8.field_2.z;
  local_188.field_0.x = local_168.field_0.x - local_f8.field_0.x;
  local_188.field_1.y = local_168.field_1.y - local_f8.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_f8,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  local_188.field_2.z = local_100.z - local_f8.field_2.z;
  local_188.field_0.x = local_108.x - local_f8.field_0.x;
  local_188.field_1.y = aStack_104.y - local_f8.field_1.y;
  local_178 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_188);
  lineToMesh(&local_e8,&local_f8,&local_178,fVar1);
  Mesh::append(__return_storage_ptr__,&local_e8);
  Mesh::~Mesh(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Mesh cubeCornersMesh(const glm::vec3 &_min_v, const glm::vec3 &_max_v, float _size) {
    float size = glm::min(glm::length(_min_v), glm::length(_max_v)) * _size *  0.5;

    //    D ---- A
    // C ---- B  |
    // |  |   |  |
    // |  I --|- F
    // H .... G

    glm::vec3 A = _max_v;
    glm::vec3 H = _min_v;

    glm::vec3 B = glm::vec3(A.x, A.y, H.z);
    glm::vec3 C = glm::vec3(H.x, A.y, H.z);
    glm::vec3 D = glm::vec3(H.x, A.y, A.z);

    glm::vec3 F = glm::vec3(A.x, H.y, A.z);
    glm::vec3 G = glm::vec3(A.x, H.y, H.z);
    glm::vec3 I = glm::vec3(H.x, H.y, A.z);

    Mesh mesh;
    mesh.setDrawMode(LINES);
    mesh.append( lineToMesh(A, normalize(D-A), size) );
    mesh.append( lineToMesh(A, normalize(B-A), size) );
    mesh.append( lineToMesh(A, normalize(F-A), size) );

    mesh.append( lineToMesh(B, normalize(A-B), size) );
    mesh.append( lineToMesh(B, normalize(C-B), size) );
    mesh.append( lineToMesh(B, normalize(G-B), size) );

    mesh.append( lineToMesh(C, normalize(D-C), size) );
    mesh.append( lineToMesh(C, normalize(B-C), size) );
    mesh.append( lineToMesh(C, normalize(H-C), size) );
    
    mesh.append( lineToMesh(D, normalize(A-D), size) );
    mesh.append( lineToMesh(D, normalize(C-D), size) );
    mesh.append( lineToMesh(D, normalize(I-D), size) );

    mesh.append( lineToMesh(F, normalize(G-F), size) );
    mesh.append( lineToMesh(F, normalize(A-F), size) );
    mesh.append( lineToMesh(F, normalize(I-F), size) );

    mesh.append( lineToMesh(G, normalize(H-G), size) );
    mesh.append( lineToMesh(G, normalize(F-G), size) );
    mesh.append( lineToMesh(G, normalize(B-G), size) );

    mesh.append( lineToMesh(H, normalize(I-H), size) );
    mesh.append( lineToMesh(H, normalize(G-H), size) );
    mesh.append( lineToMesh(H, normalize(C-H), size) );

    mesh.append( lineToMesh(I, normalize(F-I), size) );
    mesh.append( lineToMesh(I, normalize(H-I), size) );
    mesh.append( lineToMesh(I, normalize(D-I), size) );

    return mesh;
}